

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ysf.cpp
# Opt level: O0

void __thiscall DSDcc::DSDYSF::processVD2(DSDYSF *this,int symbolIndex,uchar dibit)

{
  bool bVar1;
  int iVar2;
  uchar in_DL;
  int in_ESI;
  DSDYSF *in_RDI;
  DSDYSF *unaff_retaddr;
  uchar *in_stack_00000008;
  DSDYSF *in_stack_00000010;
  uchar bytes [12];
  uint in_stack_000000b8;
  uint in_stack_000000bc;
  uchar *in_stack_000000c0;
  uchar *in_stack_000000c8;
  Viterbi5 *in_stack_000000d0;
  undefined8 local_19;
  undefined2 local_11;
  uchar dibit_00;
  DSDYSF *xoredBytes;
  
  if (in_ESI < 0x14) {
    in_RDI->m_fichRaw[*(int *)(m_fichInterleave + (long)in_ESI * 4)] = in_DL;
  }
  else {
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    dibit_00 = (uchar)((ulong)in_RDI >> 0x18);
    if (in_ESI < 0x48) {
      processVD2Voice(unaff_retaddr,iVar2,dibit_00);
    }
    else if (in_ESI < 0x5c) {
      in_RDI->m_fichRaw[*(int *)(m_fichInterleave + (long)(in_ESI + -0x34) * 4)] = in_DL;
    }
    else if (in_ESI < 0x90) {
      processVD2Voice(unaff_retaddr,iVar2,dibit_00);
    }
    else if (in_ESI < 0xa4) {
      in_RDI->m_fichRaw[*(int *)(m_fichInterleave + (long)(in_ESI + -0x68) * 4)] = in_DL;
    }
    else if (in_ESI < 0xd8) {
      processVD2Voice(unaff_retaddr,iVar2,dibit_00);
    }
    else if (in_ESI < 0xec) {
      in_RDI->m_fichRaw[*(int *)(m_fichInterleave + (long)(in_ESI + -0x9c) * 4)] = in_DL;
    }
    else if (in_ESI < 0x120) {
      processVD2Voice(unaff_retaddr,iVar2,dibit_00);
    }
    else if (in_ESI < 0x134) {
      in_RDI->m_fichRaw[*(int *)(m_fichInterleave + (long)(in_ESI + -0xd0) * 4)] = in_DL;
      if (in_ESI == 0x133) {
        xoredBytes = in_RDI;
        Viterbi5::decodeFromSymbols
                  (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
                   in_stack_000000b8);
        bVar1 = checkCRC16(in_stack_00000010,in_stack_00000008,(unsigned_long)unaff_retaddr,
                           (uchar *)xoredBytes);
        if (bVar1) {
          iVar2 = FICH::getFrameNumber(&in_RDI->m_fich);
          switch(iVar2) {
          case 0:
            *(undefined8 *)in_RDI->m_dest = local_19;
            *(undefined2 *)(in_RDI->m_dest + 8) = local_11;
            in_RDI->m_dest[10] = '\0';
            break;
          case 1:
            *(undefined8 *)in_RDI->m_src = local_19;
            *(undefined2 *)(in_RDI->m_src + 8) = local_11;
            in_RDI->m_src[10] = '\0';
            break;
          case 2:
            *(undefined8 *)in_RDI->m_downlink = local_19;
            *(undefined2 *)(in_RDI->m_downlink + 8) = local_11;
            in_RDI->m_downlink[10] = '\0';
            break;
          case 3:
            *(undefined8 *)in_RDI->m_uplink = local_19;
            *(undefined2 *)(in_RDI->m_uplink + 8) = local_11;
            in_RDI->m_uplink[10] = '\0';
            break;
          case 4:
            processCSD3_1(in_RDI,(uchar *)&local_19);
            break;
          case 5:
            processCSD3_2(in_RDI,(uchar *)&local_19);
          }
        }
      }
    }
    else if (in_ESI < 0x168) {
      processVD2Voice(unaff_retaddr,iVar2,dibit_00);
    }
  }
  return;
}

Assistant:

void DSDYSF::processVD2(int symbolIndex, unsigned char dibit)
{
    if (symbolIndex < 20) // DCH(0) - reuse FICH buffer
    {
        m_fichRaw[m_fichInterleave[symbolIndex]] = dibit;
    }
    else if (symbolIndex < 20 + 52) // VCH(0) and VeCH(0)
    {
        processVD2Voice(symbolIndex - 20, dibit);
    }
    else if (symbolIndex < 2*20 + 52) // DCH(1)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 52]] = dibit;
    }
    else if (symbolIndex < 2*20 + 2*52) // VCH(1) and VeCH(1)
    {
        processVD2Voice(symbolIndex - (2*20 + 52), dibit);
    }
    else if (symbolIndex < 3*20 + 2*52) // DCH(2)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 2*52]] = dibit;
    }
    else if (symbolIndex < 3*20 + 3*52) // VCH(2) and VeCH(2)
    {
        processVD2Voice(symbolIndex - (3*20 + 2*52), dibit);
    }
    else if (symbolIndex < 4*20 + 3*52) // DCH(3)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 3*52]] = dibit;
    }
    else if (symbolIndex < 4*20 + 4*52) // VCH(3) and VeCH(3)
    {
        processVD2Voice(symbolIndex - (4*20 + 3*52), dibit);
    }
    else if (symbolIndex < 5*20 + 4*52) // DCH(4)
    {
        m_fichRaw[m_fichInterleave[symbolIndex - 4*52]] = dibit;

        if (symbolIndex == (5*20 + 4*52) - 1) // Final DCH
        {
            unsigned char bytes[12];

            m_viterbiFICH.decodeFromSymbols(m_fichGolay, m_fichRaw, 100, 0); // reuse FICH

            if (checkCRC16(m_fichGolay, 10, bytes))
            {
                switch (m_fich.getFrameNumber())
                {
                case 0:
                    memcpy(m_dest, bytes, 10);
                    m_dest[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2: Dest: " << m_dest << std::endl;
                    break;
                case 1:
                    memcpy(m_src, bytes, 10);
                    m_src[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2:  Src: " << m_src << std::endl;
                    break;
                case 2:
                    memcpy(m_downlink, bytes, 10);
                    m_downlink[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2:  D/L: " << m_downlink << std::endl;
                    break;
                case 3:
                    memcpy(m_uplink, bytes, 10);
                    m_uplink[10] = '\0';
//                    std::cerr << "DSDYSF::processVD2:  U/L: " << m_uplink << std::endl;
                    break;
                case 4:
                    processCSD3_1(bytes);
                    break;
                case 5:
                    processCSD3_2(bytes);
                    break;
                default:
                    break;
                }
            }
        }
    }
    else if (symbolIndex < 5*20 + 5*52) // DCH(4)
    {
        processVD2Voice(symbolIndex - (5*20 + 4*52), dibit);
    }
}